

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int lnsrchcg(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *jac,double *p,
            int N,double *dx,double maxstep,double eps2,double stol,double *x,double *jacf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  double *C;
  double *C_00;
  double *A;
  double *B;
  double *C_01;
  double *array;
  double *B_00;
  ulong uVar6;
  double *pdVar7;
  char *__format;
  ulong uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  undefined4 uVar13;
  double dVar12;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_100;
  double local_c8;
  undefined8 local_b8;
  double local_88;
  uint local_5c;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  A = (double *)malloc(0x20);
  B = (double *)malloc(0x10);
  C_01 = (double *)malloc(0x10);
  array = (double *)malloc((long)N * 8);
  B_00 = (double *)malloc((long)N * 8);
  uVar8 = (ulong)(uint)N;
  dVar1 = 0.0;
  if (0 < N) {
    uVar6 = 0;
    dVar1 = 0.0;
    do {
      dVar1 = dVar1 + dx[uVar6] * p[uVar6] * dx[uVar6] * p[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if (maxstep < dVar1) {
    scale(p,1,N,maxstep / dVar1);
    dVar1 = maxstep;
  }
  mmult(jac,p,C,1,N,1);
  if (0 < N) {
    uVar6 = 0;
    do {
      dVar15 = ABS(xi[uVar6]);
      if (ABS(xi[uVar6]) <= 1.0 / ABS(dx[uVar6])) {
        dVar15 = 1.0 / ABS(dx[uVar6]);
      }
      array[uVar6] = p[uVar6] / dVar15;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  dVar2 = array_max_abs(array,N);
  dVar15 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if (ABS(dVar15) < 1.79769313486232e+308) {
    if (NAN(dVar15)) {
LAB_001317b7:
      __format = "Program Exiting as the function returns NaN";
      goto LAB_001317be;
    }
    dVar2 = stol / dVar2;
    dVar3 = maxstep / dVar1;
    local_88 = 1.0;
    local_5c = 100;
    local_b8 = 1.0;
    local_100 = 1.0;
    while( true ) {
      if (0 < N) {
        uVar6 = 0;
        do {
          B_00[uVar6] = p[uVar6] * local_100;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
      madd(xi,B_00,x,1,N);
      dVar10 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar10)) break;
      if (NAN(dVar10)) goto LAB_001317b7;
      dVar11 = *C;
      dVar14 = local_100;
      if (dVar10 <= local_100 * 0.0001 * dVar11 + dVar15) {
        iVar5 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
        if (iVar5 == 0xf) {
          return 0xf;
        }
        mmult(jacf,p,C_00,1,N,1);
        local_5c = 0;
        if (*C * -0.9 <= ABS(*C_00)) {
          if (((dVar1 < maxstep) && (local_100 == 1.0)) && (!NAN(local_100))) {
            dVar11 = dVar10;
            while( true ) {
              dVar10 = dVar11;
              if (((local_100 * 0.0001 * *C + dVar15 < dVar10) && (ABS(*C_00) < *C * -0.9)) &&
                 (dVar3 <= local_100)) break;
              dVar14 = local_100 + local_100;
              if (dVar3 <= local_100 + local_100) {
                dVar14 = dVar3;
              }
              if (0 < N) {
                uVar6 = 0;
                do {
                  B_00[uVar6] = p[uVar6] * dVar14;
                  uVar6 = uVar6 + 1;
                } while (uVar8 != uVar6);
              }
              madd(xi,B_00,x,1,N);
              dVar11 = (*funcpt->funcpt)(x,N,funcpt->params);
              if (1.79769313486232e+308 <= ABS(dVar11)) goto LAB_001317ae;
              if (NAN(dVar11)) goto LAB_001317b7;
              local_b8._0_4_ = SUB84(local_100,0);
              local_b8._4_4_ = (undefined4)((ulong)local_100 >> 0x20);
              local_100 = dVar14;
              local_88 = dVar10;
              if (dVar11 <= dVar14 * 0.0001 * *C + dVar15) {
                iVar5 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
                if (iVar5 == 0xf) {
                  return 0xf;
                }
                mmult(jacf,p,C_00,1,N,1);
              }
            }
          }
          dVar14 = local_100;
          if ((local_100 < 1.0) ||
             ((1.0 < local_100 && (local_100 * 0.0001 * *C + dVar15 < dVar10)))) {
            dVar16 = ABS(local_b8 - local_100);
            dVar11 = *C_00;
            uVar9 = SUB84(dVar11,0);
            uVar13 = (undefined4)((ulong)dVar11 >> 0x20);
            if ((*C * -0.9 <= ABS(dVar11)) || (dVar2 < dVar16)) {
              local_c8 = dVar10;
              if (local_b8 <= local_100) {
                local_c8 = local_88;
              }
              dVar10 = (double)(~-(ulong)(local_100 < local_b8) & (ulong)dVar10 |
                               -(ulong)(local_100 < local_b8) & (ulong)local_88);
              if (local_b8 <= local_100) {
                local_100 = local_b8;
              }
              do {
                dVar11 = dVar10 - ((double)CONCAT44(uVar13,uVar9) * dVar16 + local_c8);
                dVar14 = (-(double)CONCAT44(uVar13,uVar9) * dVar16 * dVar16) / (dVar11 + dVar11);
                dVar11 = dVar16 * 0.2;
                if (dVar16 * 0.2 <= dVar14) {
                  dVar11 = dVar14;
                }
                dVar14 = local_100 + dVar11;
                if (0 < N) {
                  uVar6 = 0;
                  do {
                    B_00[uVar6] = p[uVar6] * dVar14;
                    uVar6 = uVar6 + 1;
                  } while (uVar8 != uVar6);
                }
                madd(xi,B_00,x,1,N);
                dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
                if (1.79769313486232e+308 <= ABS(dVar12)) goto LAB_001317ae;
                if (NAN(dVar12)) goto LAB_001317b7;
                dVar17 = dVar11;
                dVar4 = dVar12;
                if (dVar12 <= dVar14 * 0.0001 * *C + dVar15) {
                  iVar5 = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
                  if (iVar5 == 0xf) {
                    return 0xf;
                  }
                  mmult(jacf,p,C_00,1,N,1);
                  dVar17 = dVar16;
                  dVar4 = dVar10;
                  if (*C * -0.9 <= ABS(*C_00)) {
                    dVar17 = dVar16 - dVar11;
                    local_100 = dVar14;
                    local_c8 = dVar12;
                  }
                }
                dVar10 = dVar4;
                dVar11 = *C_00;
                uVar9 = SUB84(dVar11,0);
                uVar13 = (undefined4)((ulong)dVar11 >> 0x20);
                dVar16 = dVar17;
              } while ((*C * -0.9 <= ABS(dVar11)) || (dVar2 < dVar17));
            }
          }
        }
      }
      else if (dVar2 <= local_100) {
        uVar6 = (ulong)DAT_00158750;
        if ((local_100 != 1.0) || (NAN(local_100))) {
          *A = 1.0 / (local_100 * local_100);
          A[1] = -1.0 / (local_b8 * local_b8);
          A[2] = (double)((ulong)local_b8 ^ uVar6) / (local_100 * local_100);
          A[3] = local_100 / (local_b8 * local_b8);
          *B = (dVar10 - dVar15) - local_100 * dVar11;
          B[1] = (local_88 - dVar15) - local_b8 * dVar11;
          mmult(A,B,C_01,2,2,1);
          scale(C_01,1,2,1.0 / (local_100 - local_b8));
          dVar11 = *C_01;
          if ((dVar11 != 0.0) || (NAN(dVar11))) {
            dVar14 = C_01[1];
            dVar11 = dVar14 * dVar14 + dVar11 * -3.0 * *C;
            if (dVar11 < 0.0) {
              dVar11 = sqrt(dVar11);
            }
            else {
              dVar11 = SQRT(dVar11);
            }
            dVar11 = dVar11 - dVar14;
            dVar14 = 3.0;
            pdVar7 = C_01;
          }
          else {
            dVar11 = (double)((ulong)*C ^ (ulong)DAT_00158750);
            dVar14 = 2.0;
            pdVar7 = C_01 + 1;
          }
          dVar11 = dVar11 / (dVar14 * *pdVar7);
          if (local_100 * 0.5 < dVar11) {
            dVar11 = local_100 * 0.5;
          }
        }
        else {
          dVar14 = (dVar10 - dVar15) - dVar11;
          dVar11 = (double)((ulong)dVar11 ^ uVar6) / (dVar14 + dVar14);
        }
        uVar6 = -(ulong)(dVar11 <= local_100 * 0.1);
        dVar14 = (double)(~uVar6 & (ulong)dVar11 | (ulong)(local_100 * 0.1) & uVar6);
        local_88 = dVar10;
        local_b8 = local_100;
      }
      else {
        local_5c = 1;
        if (0 < N) {
          uVar6 = 0;
          do {
            x[uVar6] = xi[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
      }
      local_100 = dVar14;
      if (local_5c < 2) {
        free(C);
        free(A);
        free(B);
        free(C_01);
        free(array);
        free(B_00);
        free(C_00);
        return local_5c;
      }
    }
  }
LAB_001317ae:
  __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_001317be:
  printf(__format);
  return 0xf;
}

Assistant:

int lnsrchcg(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *jac, double *p, int N, double * dx, double maxstep,
	double eps2,double stol,double *x,double *jacf) {
	int retval,i,gfdcode;
	double alpha,lambda,lambdamin,funcf,funci,lambdaprev,lambdatemp,funcprev;
	double lambda2,lambdaprev2,ll,den,rell,nlen;
	double *slopei,*temp1,*temp2,*ab,*rcheck,*pl;
	double *slopen;
	double beta,lambdamax,lambdalo,lambdainc,lambdadiff,funclo,funchi;
	
	slopei = (double*) malloc(sizeof(double) *1);
	slopen = (double*) malloc(sizeof(double) *1);
	temp1 = (double*) malloc(sizeof(double) *4);
	temp2 = (double*) malloc(sizeof(double) *2);
	ab = (double*) malloc(sizeof(double) *2);
	rcheck = (double*) malloc(sizeof(double) *N);
	pl = (double*) malloc(sizeof(double) *N);
	retval = 100;
	alpha = 1e-04;
	lambda = 1.0;
	nlen = 0.0;
	beta = 0.9;
	gfdcode = 0;
	funcprev = 1.0; // funcprev and lambdaprev are initialized to suppress warnings
	lambdaprev = 1.0; // These values are not used as the program sets the value later on.
	
	for(i = 0; i < N;++i) {
		nlen += dx[i] * p[i] * dx[i] * p[i];
	}
	nlen = sqrt(nlen);
	
	if (nlen > maxstep) {
		scale(p,1,N,maxstep/nlen);
		nlen = maxstep;
	}
	
	mmult(jac,p,slopei,1,N,1);
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 /fabs(dx[i])) {
			den = fabs(xi[i]);
		} else {
			den = 1.0 /fabs(dx[i]);
		}
		rcheck[i] = p[i]/den;
	}
	
	rell = array_max_abs(rcheck,N);
	
	lambdamin = stol/rell;
	
	funci = FUNCPT_EVAL(funcpt, xi, N);
	
	if (funci >= DBL_MAX || funci <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		return 15;
	}
	if (funci != funci) {
		printf("Program Exiting as the function returns NaN");
		return 15;
	}
	while (retval > 1) {
		for(i = 0; i < N;++i) {
			pl[i] = p[i] * lambda;
		}
		madd(xi,pl,x,1,N);
		funcf = FUNCPT_EVAL(funcpt, x, N);
		if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (funcf != funcf) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		if (funcf <= funci + alpha *lambda *slopei[0]) {
			gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
			if (gfdcode == 15) {
				return 15;
			}
			mmult(jacf,p,slopen,1,N,1);
			if(fabs(slopen[0]) >= - beta * slopei[0]) {
					if (lambda == 1.0 && nlen < maxstep) {
						lambdamax = maxstep / nlen;
						while (funcf <= funci + alpha *lambda *slopei[0] || fabs(slopen[0]) >= -beta * slopei[0] || lambda < lambdamax) {
							lambdaprev = lambda;
							funcprev = funcf;
							if ( 2*lambda < lambdamax) {
								lambda = 2*lambda;
							} else {
								lambda = lambdamax;
							}
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								return 15;
							}
							if (funcf <= funci + alpha *lambda *slopei[0]) {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
							}
						}
					}
					if (lambda < 1.0 || (lambda > 1.0 && funcf > funci + alpha *lambda *slopei[0])) {
						if (lambda < lambdaprev) {
							lambdalo = lambda; 
						} else {
							lambdalo = lambdaprev; 
						}
						lambdadiff = fabs(lambdaprev - lambda);
						
						if (lambda < lambdaprev) {
							funclo = funcf;
							funchi = funcprev;
						} else {
							funchi = funcf;
							funclo = funcprev;
						}
						while (fabs(slopen[0]) >= -beta * slopei[0] || lambdadiff > lambdamin) {
							lambdainc = -slopen[0] * lambdadiff * lambdadiff / (2.0 * (funchi - (funclo + slopen[0] *lambdadiff)));
							if ( lambdainc < 0.2 * lambdadiff) {
								lambdainc = 0.2 * lambdadiff;
							}
							lambda = lambdalo + lambdainc;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambda;
							}
							madd(xi,pl,x,1,N);
							funcf = FUNCPT_EVAL(funcpt, x, N);
							if (funcf >= DBL_MAX || funcf <= -DBL_MAX) {
								printf("Program Exiting as the function value exceeds the maximum double value");
								return 15;
							}
							if (funcf != funcf) {
								printf("Program Exiting as the function returns NaN");
								return 15;
							}
							if (funcf > funci + alpha *lambda *slopei[0]) {
								lambdadiff = lambdainc;
								funchi = funcf;
							} else {
								gfdcode = grad_fd(funcpt,funcgrad,x,N,dx,eps2,jacf);
								if (gfdcode == 15) {
									return 15;
								}
								mmult(jacf,p,slopen,1,N,1);
								if (fabs(slopen[0]) >= -beta * slopei[0]) {
									lambdalo = lambda;
									lambdadiff -= lambdainc;
									funclo = funcf;
								}
							}
						}
						if (fabs(slopen[0]) >= -beta * slopei[0]) {
							funcf = funclo;
							for(i = 0; i < N;++i) {
								pl[i] = p[i] * lambdalo;
							}
							madd(xi,pl,x,1,N);
						}
					}
						
			}
			
			retval = 0;
		} else if (lambda < lambdamin) {
			retval = 1;
			for (i = 0; i < N;++i) {
				x[i] = xi[i]; // Check
			}
		} else {
			if (lambda == 1.0) {
				lambdatemp = - slopei[0] / (2.0 * (funcf - funci - slopei[0])); 
			} else {
				
				lambda2 = lambda * lambda;
				lambdaprev2 = lambdaprev * lambdaprev;
				ll = lambda - lambdaprev;
				temp1[0] = 1.0 / lambda2; temp1[1] = -1.0 /lambdaprev2;
				temp1[2] = - lambdaprev / lambda2; temp1[3] = lambda /lambdaprev2;
				temp2[0] = funcf - funci - lambda * slopei[0];
				temp2[1] = funcprev - funci - lambdaprev * slopei[0];
				mmult(temp1,temp2,ab,2,2,1);
				scale(ab,1,2,1.0/ll);
				if (ab[0] == 0.0) {
					lambdatemp = - slopei[0] / (2.0 * ab[1]);
				} else {
					lambdatemp = (-ab[1] + sqrt( ab[1] * ab[1] - 3.0 * ab[0] *slopei[0]))/ (3.0 * ab[0]);
				}
				if (lambdatemp > 0.5 * lambda) {
					lambdatemp = 0.5 * lambda;
				}
			}
			lambdaprev = lambda;
			funcprev = funcf;
			if (lambdatemp <= 0.1 * lambda) {
				lambda = 0.1 * lambda;
			} else {
				lambda = lambdatemp;
			}
		}
	
	}
	
	free(slopei);
	free(temp1);
	free(temp2);
	free(ab);
	free(rcheck);
	free(pl);
	free(slopen);
	return retval;
}